

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

int __thiscall QAccessibleAbstractScrollArea::childCount(QAccessibleAbstractScrollArea *this)

{
  long in_FS_OFFSET;
  QWidgetList local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  accessibleChildren(&local_28,this);
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (int)local_28.d.size;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleAbstractScrollArea::childCount() const
{
    return accessibleChildren().size();
}